

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  element_type *peVar1;
  int iVar2;
  TokenStream *pTVar3;
  TokenStream remainingTokens;
  Result validationResult;
  TokenStream local_108;
  undefined1 local_d8 [16];
  _Alloc_hider _Stack_c8;
  undefined1 local_c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_90 [16];
  BasicResult<void> local_80;
  ParseResultType local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_38;
  
  (*(this->super_ParserRefImpl<Catch::clara::detail::Arg>).
    super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
            (&local_80);
  if (local_80.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    local_108.it._M_current = (tokens->it)._M_current;
    local_108.itEnd._M_current = (tokens->itEnd)._M_current;
    this_00 = &local_108.m_tokenBuffer;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              (this_00,&tokens->m_tokenBuffer);
    TokenStream::operator*((Token *)&local_a8,&local_108);
    if (local_a8._M_allocated_capacity._0_4_ == 1) {
      iVar2 = (*((this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref.
                 super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_BoundRef[3])();
      if ((char)iVar2 != '\0') {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                      ,0x248a,
                      "virtual InternalParseResult Catch::clara::detail::Arg::parse(const std::string &, const TokenStream &) const"
                     );
      }
      if (local_108.m_tokenBuffer.
          super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_108.m_tokenBuffer.
          super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!m_tokenBuffer.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                      ,0x22d7,"const Token *Catch::clara::detail::TokenStream::operator->() const");
      }
      peVar1 = (this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_BoundRef[4])
                (local_d8,peVar1,
                 &(local_108.m_tokenBuffer.
                   super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_start)->token);
      if (local_d8._8_4_ == Ok) {
        pTVar3 = TokenStream::operator++(&local_108);
        local_50 = Matched;
        local_48 = (pTVar3->it)._M_current;
        pbStack_40 = (pTVar3->itEnd)._M_current;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&local_38,&pTVar3->m_tokenBuffer);
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase.m_type = Ok;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00224290;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_50;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = local_48;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pbStack_40;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,&local_38);
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00224238;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
        (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(&local_38);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (__return_storage_ptr__,
                   (BasicResult<Catch::clara::detail::ParseResultType> *)local_d8);
      }
      local_d8._0_8_ = &PTR__BasicResult_00224398;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c8._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c0 + 8)) {
        operator_delete(_Stack_c8._M_p);
      }
    }
    else {
      local_d8._0_4_ = 1;
      local_d8._8_8_ = local_108.it._M_current;
      _Stack_c8._M_p = (pointer)local_108.itEnd._M_current;
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
                ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)local_c0,this_00);
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = Ok;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00224290;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
      m_value.m_type = local_d8._0_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
      m_value.m_remainingTokens.it._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
      m_value.m_remainingTokens.itEnd._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c8._M_p;
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
                (&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                  field_0.m_value.m_remainingTokens.m_tokenBuffer,
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)local_c0);
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00224238;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
              local_c0);
    }
    if ((char *)local_a8._8_8_ != local_90) {
      operator_delete((void *)local_a8._8_8_);
    }
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (this_00);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_80);
  }
  local_80.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_002241d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_errorMessage._M_dataplus._M_p != &local_80.m_errorMessage.field_2) {
    operator_delete(local_80.m_errorMessage._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }